

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int kmp_set_affinity_mask_proc(int proc,void **mask)

{
  int iVar1;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar1 = __kmp_aux_set_affinity_mask_proc(proc,mask);
  return iVar1;
}

Assistant:

int FTN_STDCALL FTN_SET_AFFINITY_MASK_PROC(int KMP_DEREF proc, void **mask) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  return __kmp_aux_set_affinity_mask_proc(KMP_DEREF proc, mask);
#endif
}